

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

bool utils::inputWaiting(void)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  timeval tv;
  fd_set fds;
  
  tv.tv_sec = 0;
  tv.tv_usec = 1;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    fds.fds_bits[lVar3] = 0;
  }
  iVar1 = fileno(_stdin);
  iVar2 = fileno(_stdin);
  fds.fds_bits[iVar2 / 0x40] = fds.fds_bits[iVar2 / 0x40] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
  iVar1 = select(0x400,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
  return iVar1 != 0;
}

Assistant:

bool utils::inputWaiting()
{
#ifdef WIN32
    static int init = 0, pipe;
    static HANDLE inh;
    DWORD dw;
    if (!init) {
        init = 1;
        inh = GetStdHandle(STD_INPUT_HANDLE);
        pipe = !GetConsoleMode(inh, &dw);
        if (!pipe) {
            SetConsoleMode(inh, dw & ~(ENABLE_MOUSE_INPUT | ENABLE_WINDOW_INPUT));
            FlushConsoleInputBuffer(inh);
        }
    }
    if (pipe) {
        if (!PeekNamedPipe(inh, NULL, 0, NULL, &dw, NULL)) {
            return 1;
        }
        return dw > 0;
    }
    else {
        GetNumberOfConsoleInputEvents(inh, &dw);
        return dw <= 1 ? false : dw > 0;
    }
#elif __APPLE__
    fd_set fds;
    struct timeval tv;
    FD_ZERO(&fds);
    FD_SET(fileno(stdin), &fds);
    return select(sizeof(fds) * 8, &fds, nullptr, nullptr, &tv);
#else
    fd_set fds;
    struct timeval tv
    {
        0, 1
    };
    FD_ZERO(&fds);
    FD_SET(fileno(stdin), &fds);
    return select(sizeof(fds) * 8, &fds, nullptr, nullptr, &tv);
#endif
}